

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

int __thiscall CppJieba::MPSegment::init(MPSegment *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  char *pcVar3;
  undefined7 extraout_var_00;
  undefined8 uVar4;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar5;
  char *local_160;
  char *local_148;
  char *local_128;
  char *local_110;
  char *local_f8;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [16];
  allocator local_31;
  string local_30 [16];
  char *in_stack_ffffffffffffffe0;
  Trie *in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = SegmentBase::_getInitFlag(&this->super_SegmentBase);
  if (bVar1) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp";
    }
    else {
      local_f8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                         ,0x2f);
      local_f8 = local_f8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"already inited before now.",&local_31);
    Limonp::Logger::LoggingF(3,local_f8,0x2f,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = false;
    uVar5 = extraout_var;
  }
  else {
    uVar2 = Trie::init(&this->_trie,ctx);
    if ((uVar2 & 1) == 0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        local_110 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
        ;
      }
      else {
        local_110 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                            ,0x2f);
        local_110 = local_110 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"_trie.init failed.",&local_69);
      Limonp::Logger::LoggingF(3,local_110,0x34,(string *)local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      local_1 = false;
      uVar5 = extraout_var_00;
    }
    else {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        local_128 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
        ;
      }
      else {
        local_128 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                            ,0x2f);
        local_128 = local_128 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"_trie.loadDict(%s) start...",&local_91);
      uVar4 = std::__cxx11::string::c_str();
      Limonp::Logger::LoggingF(1,local_128,0x37,(string *)local_90,uVar4);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::c_str();
      bVar1 = Trie::loadDict(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      if (bVar1) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          local_160 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
          ;
        }
        else {
          local_160 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                              ,0x2f);
          local_160 = local_160 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"_trie.loadDict end.",&local_e1);
        Limonp::Logger::LoggingF(1,local_160,0x3d,(string *)local_e0);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        local_1 = SegmentBase::_setInitFlag(&this->super_SegmentBase,true);
        uVar5 = extraout_var_02;
      }
      else {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          local_148 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
          ;
        }
        else {
          local_148 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                              ,0x2f);
          local_148 = local_148 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"_trie.loadDict faield.",&local_b9);
        Limonp::Logger::LoggingF(3,local_148,0x3a,(string *)local_b8);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        local_1 = false;
        uVar5 = extraout_var_01;
      }
    }
  }
  return (int)CONCAT71(uVar5,local_1);
}

Assistant:

virtual bool init()
            {
                if(_getInitFlag())
                {
                    LogError("already inited before now.");
                    return false;
                }
                if(!_trie.init())
                {
                    LogError("_trie.init failed.");
                    return false;
                }
                LogInfo("_trie.loadDict(%s) start...", _dictPath.c_str());
                if(!_trie.loadDict(_dictPath.c_str()))
                {
                    LogError("_trie.loadDict faield.");
                    return false;
                }
                LogInfo("_trie.loadDict end.");
                return _setInitFlag(true);
            }